

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstsstore.cpp
# Opt level: O2

QList<QHstsPolicy> * __thiscall
QHstsStore::readPolicies(QList<QHstsPolicy> *__return_storage_ptr__,QHstsStore *this)

{
  bool bVar1;
  char cVar2;
  QString *key;
  QString *key_00;
  long lVar3;
  long in_FS_OFFSET;
  QHstsPolicy restoredPolicy;
  QArrayDataPointer<QString> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QHstsPolicy *)0x0;
  (__return_storage_ptr__->d).size = 0;
  beginHstsGroups(this);
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QSettings::childKeys();
  key_00 = local_88.ptr;
  for (lVar3 = local_88.size * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
    restoredPolicy.d.d.ptr = (QSharedDataPointer<QHstsPolicyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QHstsPolicy::QHstsPolicy(&restoredPolicy);
    bVar1 = deserializePolicy(this,key_00,&restoredPolicy);
    if (bVar1) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QString::toLatin1_helper((QString *)&local_70);
      QByteArray::fromHex((QByteArray *)&local_58);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_70);
      QString::fromUtf8<void>((QString *)&local_70,(QByteArray *)&local_58);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
      QHstsPolicy::setHost(&restoredPolicy,(QString *)&local_70,DecodedMode);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      QList<QHstsPolicy>::emplaceBack<QHstsPolicy>(__return_storage_ptr__,&restoredPolicy);
    }
    else {
      cVar2 = QSettings::isWritable();
      if (cVar2 != '\0') {
        evictPolicy(this,key_00);
      }
    }
    QHstsPolicy::~QHstsPolicy(&restoredPolicy);
    key_00 = key_00 + 1;
  }
  endHstsGroups(this);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QHstsPolicy> QHstsStore::readPolicies()
{
    // This function only attempts to read policies, making no decision about
    // expired policies. It's up to a user (QHstsCache) to mark these policies
    // for deletion and sync the store later. But we immediately remove keys/values
    // (if the store isWritable) for the policies that we fail to read.
    QList<QHstsPolicy> policies;

    beginHstsGroups();

    const QStringList keys = store.childKeys();
    for (const auto &key : keys) {
        QHstsPolicy restoredPolicy;
        if (deserializePolicy(key, restoredPolicy)) {
            restoredPolicy.setHost(settings_key_to_host_name(key));
            policies.push_back(std::move(restoredPolicy));
        } else if (isWritable()) {
            evictPolicy(key);
        }
    }

    endHstsGroups();

    return policies;
}